

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Parser_TestInvalidUnexpectedFunction_Test::TestBody
          (Parser_TestInvalidUnexpectedFunction_Test *this)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"test:1:2-10: unexpected: function while parsing field definition",
             "");
  testParseError("{function(a, b) a+b: true}",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Parser, TestInvalidNoComma)
{
    testParseError("{a: b c:d}", "test:1:7: expected a comma before next field.");
}